

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid,REF_INT nequ,REF_DBL *flux,REF_DBL *res)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  REF_STATUS RVar7;
  REF_DBL *scalar;
  REF_DBL *grad;
  ulong uVar8;
  int iVar9;
  int iVar10;
  REF_DBL (*paRVar11) [3];
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  int cell;
  int iVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  undefined4 *puVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  REF_DBL cell_vol;
  REF_DBL flux_grad [3];
  REF_INT nodes [27];
  REF_DBL *xyzs [4];
  REF_DBL tet_flux [4];
  REF_DBL macro_flux [10];
  REF_DBL macro_xyz [10] [3];
  
  ref_node = ref_grid->node;
  iVar1 = ref_node->max;
  if ((long)iVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x233,
           "ref_phys_cc_fv_embed","malloc direqu of REF_DBL negative");
    RVar7 = 1;
  }
  else {
    ref_cell = ref_grid->cell[8];
    scalar = (REF_DBL *)malloc((long)iVar1 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar17 = "malloc direqu of REF_DBL NULL";
      uVar14 = 0x233;
    }
    else {
      grad = (REF_DBL *)malloc((ulong)(uint)(iVar1 * 3) << 3);
      if (grad != (REF_DBL *)0x0) {
        iVar1 = nequ * 3;
        iVar5 = 0;
        if (0 < nequ) {
          iVar5 = nequ;
        }
        iVar10 = 0;
        lVar19 = 0;
        do {
          if (lVar19 == 3) {
            free(grad);
            free(scalar);
            uVar6 = ref_node_ghost_dbl(ref_node,res,nequ);
            if (uVar6 == 0) {
              return 0;
            }
            uVar8 = (ulong)uVar6;
            pcVar17 = "ghost res";
            uVar14 = 0x275;
LAB_001b2ae1:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   uVar14,"ref_phys_cc_fv_embed",uVar8,pcVar17);
            return (REF_STATUS)uVar8;
          }
          iVar12 = iVar10;
          for (iVar18 = 0; iVar18 != iVar5; iVar18 = iVar18 + 1) {
            uVar8 = (ulong)(uint)ref_node->max;
            if (ref_node->max < 1) {
              uVar8 = 0;
            }
            iVar9 = iVar12;
            for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
              if (-1 < ref_node->global[uVar13]) {
                scalar[uVar13] = flux[iVar9];
              }
              iVar9 = iVar9 + iVar1;
            }
            uVar6 = ref_recon_gradient(ref_grid,scalar,grad,REF_RECON_L2PROJECTION);
            if (uVar6 != 0) {
              uVar8 = (ulong)uVar6;
              pcVar17 = "grad";
              uVar14 = 0x23b;
              goto LAB_001b2ae1;
            }
            iVar9 = (int)lVar19 * nequ + iVar18;
            for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
              RVar7 = ref_cell_nodes(ref_cell,cell,nodes);
              if (RVar7 == 0) {
                uVar6 = ref_cell->node_per;
                uVar8 = 0;
                if (0 < (int)uVar6) {
                  uVar8 = (ulong)uVar6;
                }
                paRVar11 = macro_xyz;
                for (uVar13 = 0; uVar13 != uVar8; uVar13 = uVar13 + 1) {
                  iVar15 = nodes[uVar13];
                  pRVar3 = ref_node->real;
                  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                    (*paRVar11)[lVar16] = pRVar3[iVar15 * 0xf + lVar16];
                  }
                  paRVar11 = paRVar11 + 1;
                }
                uVar4 = ref_cell->edge_per;
                if (ref_cell->edge_per < 1) {
                  uVar4 = 0;
                }
                paRVar11 = macro_xyz + 4;
                for (uVar13 = 0; uVar13 != uVar4; uVar13 = uVar13 + 1) {
                  iVar15 = nodes[ref_cell->e2n[uVar13 * 2]];
                  pRVar3 = ref_node->real;
                  iVar2 = nodes[ref_cell->e2n[uVar13 * 2 + 1]];
                  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                    (*paRVar11)[lVar16] =
                         (pRVar3[iVar15 * 0xf + lVar16] + pRVar3[iVar2 * 0xf + lVar16]) * 0.5;
                  }
                  paRVar11 = paRVar11 + 1;
                }
                for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
                  macro_flux[uVar13] = flux[(nodes[uVar13] * 3 + (int)lVar19) * nequ + iVar18];
                }
                for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
                  iVar15 = nodes[ref_cell->e2n[uVar8 * 2]];
                  iVar2 = nodes[ref_cell->e2n[uVar8 * 2 + 1]];
                  dVar21 = 0.0;
                  dVar22 = 0.0;
                  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                    dVar23 = ref_node->real[iVar2 * 0xf + lVar16] -
                             ref_node->real[iVar15 * 0xf + lVar16];
                    dVar21 = dVar21 + grad[iVar15 * 3 + lVar16] * dVar23;
                    dVar22 = dVar22 + grad[iVar2 * 3 + lVar16] * dVar23;
                  }
                  macro_flux[uVar8 + 4] =
                       (dVar21 - dVar22) * 0.125 +
                       (flux[iVar15 * iVar1 + iVar9] + flux[iVar2 * iVar1 + iVar9]) * 0.5;
                }
                puVar20 = &DAT_00207570;
                for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
                  uVar8 = (ulong)uVar6;
                  if ((int)uVar6 < 1) {
                    uVar8 = 0;
                  }
                  for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
                    iVar15 = puVar20[uVar13];
                    xyzs[uVar13] = macro_xyz[iVar15];
                    tet_flux[uVar13] = macro_flux[iVar15];
                  }
                  uVar6 = ref_node_xyz_vol(xyzs,&cell_vol);
                  if (uVar6 != 0) {
                    uVar8 = (ulong)uVar6;
                    pcVar17 = "vol";
                    uVar14 = 0x267;
                    goto LAB_001b2ae1;
                  }
                  uVar6 = ref_node_xyz_grad(xyzs,tet_flux,flux_grad);
                  if (uVar6 != 0) {
                    uVar8 = (ulong)uVar6;
                    pcVar17 = "grad";
                    uVar14 = 0x268;
                    goto LAB_001b2ae1;
                  }
                  uVar6 = ref_cell->node_per;
                  uVar8 = 0;
                  if (0 < (int)uVar6) {
                    uVar8 = (ulong)uVar6;
                  }
                  for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
                    iVar15 = nodes[uVar13] * nequ + iVar18;
                    res[iVar15] = flux_grad[lVar19] * 0.25 * cell_vol + res[iVar15];
                  }
                  puVar20 = puVar20 + 4;
                }
              }
            }
            iVar12 = iVar12 + 1;
          }
          lVar19 = lVar19 + 1;
          iVar10 = iVar10 + nequ;
        } while( true );
      }
      pcVar17 = "malloc fluxgrad of REF_DBL NULL";
      uVar14 = 0x234;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar14,
           "ref_phys_cc_fv_embed",pcVar17);
    RVar7 = 2;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_phys_cc_fv_embed(REF_GRID ref_grid, REF_INT nequ,
                                        REF_DBL *flux, REF_DBL *res) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, equ, dir, cell, cell_node, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL cell_vol, flux_grad[3];
  REF_DBL tet_flux[4], *xyzs[4];
  REF_DBL macro_flux[10], macro_xyz[10][3];
  REF_INT m2n[8][4] = {{0, 4, 5, 6}, {1, 8, 7, 4}, {2, 7, 9, 6}, {3, 6, 9, 8},
                       {4, 6, 9, 5}, {7, 8, 9, 4}, {7, 9, 5, 4}, {8, 6, 9, 4}};
  REF_INT n0, n1, macro;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT node;
  REF_DBL sdot0, sdot1, *direqu, *fluxgrad;
  REF_BOOL high_order = REF_TRUE;
  /* macro node [edge]
                                  3------9[5]--------2
                                 / \              . /
                                /   \          .   /
                               /     \      .     /
                              /       \  .       /
                             /        .\        /
                          6[2]   5[1]  8[4]   7[3]
                           /    .        \    /
                          /  .            \  /
                         /.                \/
                        0------4[0]--------1
  */

  ref_malloc(direqu, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(fluxgrad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (dir = 0; dir < 3; dir++) {
    for (equ = 0; equ < nequ; equ++) {
      each_ref_node_valid_node(ref_node, node) {
        direqu[node] = flux[equ + dir * nequ + 3 * nequ * node];
      }
      RSS(ref_recon_gradient(ref_grid, direqu, fluxgrad, recon), "grad");
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          for (i = 0; i < 3; i++) {
            macro_xyz[cell_node][i] =
                ref_node_xyz(ref_node, i, nodes[cell_node]);
          }
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          for (i = 0; i < 3; i++) {
            macro_xyz[4 + cell_edge][i] = 0.5 * (ref_node_xyz(ref_node, i, n0) +
                                                 ref_node_xyz(ref_node, i, n1));
          }
        }

        each_ref_cell_cell_node(ref_cell, cell_node) {
          i = equ + dir * nequ + 3 * nequ * nodes[cell_node];
          macro_flux[cell_node] = flux[i];
        }
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
          n1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
          macro_flux[4 + cell_edge] =
              0.5 * (flux[equ + dir * nequ + 3 * nequ * n0] +
                     flux[equ + dir * nequ + 3 * nequ * n1]);
          sdot0 = 0.0;
          sdot1 = 0.0;
          for (i = 0; i < 3; i++) {
            sdot0 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n0];
            sdot1 += (ref_node_xyz(ref_node, i, n1) -
                      ref_node_xyz(ref_node, i, n0)) *
                     fluxgrad[i + 3 * n1];
          }
          if (high_order) macro_flux[4 + cell_edge] += 0.125 * (sdot0 - sdot1);
        }
        for (macro = 0; macro < 8; macro++) {
          each_ref_cell_cell_node(ref_cell, cell_node) {
            xyzs[cell_node] = macro_xyz[m2n[macro][cell_node]];
            tet_flux[cell_node] = macro_flux[m2n[macro][cell_node]];
          }
          RSS(ref_node_xyz_vol(xyzs, &cell_vol), "vol");
          RSS(ref_node_xyz_grad(xyzs, tet_flux, flux_grad), "grad");
          each_ref_cell_cell_node(ref_cell, cell_node) {
            res[equ + nequ * nodes[cell_node]] +=
                0.25 * flux_grad[dir] * cell_vol;
          }
        }
      }
    }
  }

  ref_free(fluxgrad);
  ref_free(direqu);

  RSS(ref_node_ghost_dbl(ref_node, res, nequ), "ghost res");

  return REF_SUCCESS;
}